

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O3

void __thiscall
Js::ByteCodeWriter::Slot
          (ByteCodeWriter *this,OpCode op,RegSlot value,RegSlot instance,uint32 slotId,
          ProfileId profileId)

{
  code *pcVar1;
  uint32 slotId_00;
  bool bVar2;
  RegSlot value_00;
  RegSlot instance_00;
  undefined4 *puVar3;
  FunctionBody *pFVar4;
  undefined2 in_register_0000008a;
  uint32 local_48;
  RegSlot local_44;
  RegSlot local_40;
  uint32 local_3c;
  undefined4 local_38;
  ProfileId local_34;
  OpCode local_32 [3];
  ProfileId profileId_local;
  OpCode op_local;
  
  local_38 = CONCAT22(in_register_0000008a,profileId);
  local_3c = slotId;
  local_34 = profileId;
  local_32[0] = op;
  CheckOpen(this);
  CheckOp(this,op,(OpLayoutType)0x3b);
  bVar2 = OpCodeAttr::HasMultiSizeLayout(op);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x643,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar2) goto LAB_008916db;
    *puVar3 = 0;
  }
  if (value != 0xffffffff) {
    pFVar4 = this->m_functionWrite;
    if (pFVar4 == (FunctionBody *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
      if (!bVar2) goto LAB_008916db;
      *puVar3 = 0;
      pFVar4 = this->m_functionWrite;
    }
    value_00 = FunctionBody::MapRegSlot(pFVar4,value);
    if (instance != 0xffffffff) {
      pFVar4 = this->m_functionWrite;
      if (pFVar4 == (FunctionBody *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                    ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
        if (!bVar2) goto LAB_008916db;
        *puVar3 = 0;
        pFVar4 = this->m_functionWrite;
      }
      instance_00 = FunctionBody::MapRegSlot(pFVar4,instance);
      if ((op == LdObjSlot) || (op == LdSlot)) {
        bVar2 = DynamicProfileInfo::IsEnabled(AggressiveIntTypeSpecPhase,this->m_functionWrite);
        if (bVar2) {
          if ((short)local_38 == -1) goto LAB_008915ea;
        }
        else {
          bVar2 = DynamicProfileInfo::IsEnabled(FloatTypeSpecPhase,this->m_functionWrite);
          if (!bVar2 || (short)local_38 == -1) goto LAB_008915ea;
        }
        OpCodeUtil::ConvertNonCallOpToProfiled(local_32);
        op = local_32[0];
LAB_008915ea:
        slotId_00 = local_3c;
        bVar2 = TryWriteElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                          (this,op,value_00,instance_00,local_3c);
        if ((!bVar2) &&
           (bVar2 = TryWriteElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                              (this,local_32[0],value_00,instance_00,slotId_00), !bVar2)) {
          local_48 = slotId_00;
          local_44 = value_00;
          local_40 = instance_00;
          Data::EncodeT<(Js::LayoutSize)2>(&this->m_byteCodeData,local_32[0],this);
          Data::Write(&this->m_byteCodeData,&local_48,0xc);
        }
        bVar2 = OpCodeAttr::IsProfiledOp(local_32[0]);
        if (bVar2) {
          Data::Write(&this->m_byteCodeData,&local_34,2);
        }
        return;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x654,"(false)",
                                  "The specified OpCode is not intended for slot access");
      if (bVar2) {
        *puVar3 = 0;
        goto LAB_008915ea;
      }
      goto LAB_008916db;
    }
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar3 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                              ,0x146,"(registerID != Js::Constants::NoRegister)","bad register");
  if (bVar2) {
    *puVar3 = 0;
    Throw::InternalError();
  }
LAB_008916db:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void ByteCodeWriter::Slot(OpCode op, RegSlot value, RegSlot instance, uint32 slotId, ProfileId profileId)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::ElementSlot);
        Assert(OpCodeAttr::HasMultiSizeLayout(op));

        value = ConsumeReg(value);
        instance = ConsumeReg(instance);

        switch (op)
        {
        case OpCode::LdSlot:
        case OpCode::LdObjSlot:
            if ((DoDynamicProfileOpcode(AggressiveIntTypeSpecPhase) || DoDynamicProfileOpcode(FloatTypeSpecPhase)) &&
                profileId != Constants::NoProfileId)
            {
                OpCodeUtil::ConvertNonCallOpToProfiled(op);
            }
            break;

        default:
            AssertMsg(false, "The specified OpCode is not intended for slot access");
            break;
        }

        MULTISIZE_LAYOUT_WRITE(ElementSlot, op, value, instance, slotId);
        if (OpCodeAttr::IsProfiledOp(op))
        {
            m_byteCodeData.Encode(&profileId, sizeof(Js::ProfileId));
        }
    }